

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
cs::method_involve::preprocess
          (method_involve *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  token_base *ptVar1;
  _Elt_pointer pdVar2;
  ctrl_t *pcVar3;
  proxy *ppVar4;
  bool bVar5;
  int iVar6;
  const_reference pptVar7;
  token_base **pptVar8;
  statement_involve *psVar9;
  undefined4 extraout_var;
  shared_ptr<cs::name_space> *psVar10;
  _Elt_pointer pptVar11;
  compile_error *this_00;
  size_t sVar12;
  domain_type *domain;
  type_info *this_01;
  value_type t;
  domain_type *__range3;
  allocator local_91;
  var ns;
  tree_type<cs::token_base_*> local_88;
  tree_type<cs::token_base_*> local_80;
  const_iterator __begin3;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  sVar12 = 1;
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  t = *pptVar7 + 1;
  __begin3.inner_.ctrl_ = (ctrl_t *)(*pptVar7)[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&__begin3);
  ptVar1 = *pptVar8;
  if ((ptVar1 == (token_base *)0x0) ||
     (ptVar1->_vptr_token_base != (_func_int **)&PTR__token_value_0023ef30)) {
    psVar9 = (statement_involve *)statement_base::operator_new((statement_base *)0x30,sVar12);
    tree_type<cs::token_base_*>::tree_type(&local_88,(tree_type<cs::token_base_*> *)t);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar11 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar11 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar11 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_involve::statement_involve(psVar9,&local_88,false,(context_t *)&local_50,pptVar11[-1])
    ;
    __begin3.inner_.ctrl_ = (ctrl_t *)psVar9;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_involve*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
               (statement_involve **)&__begin3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    tree_type<cs::token_base_*>::~tree_type(&local_88);
  }
  else {
    ns.mDat = (proxy *)ptVar1[1]._vptr_token_base;
    if (ns.mDat == (proxy *)0x0) {
      ns.mDat = (proxy *)0x0;
      this_01 = (type_info *)&void::typeinfo;
    }
    else {
      (ns.mDat)->refcount = (ns.mDat)->refcount + 1;
      iVar6 = (*(ns.mDat)->data->_vptr_baseHolder[2])();
      this_01 = (type_info *)CONCAT44(extraout_var,iVar6);
    }
    bVar5 = std::type_info::operator==
                      (this_01,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
    if (!bVar5) {
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&__begin3,"Only support involve namespace.",&local_91);
      compile_error::compile_error(this_00,(string *)&__begin3);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
    psVar10 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(&ns);
    domain = ((psVar10->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_data;
    __begin3.inner_ =
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)domain);
    pcVar3 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    sVar12 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    while (__begin3.inner_.ctrl_ != pcVar3 + sVar12) {
      ppVar4 = (domain->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
               _M_impl.super__Vector_impl_data._M_start
               [*(long *)((long)__begin3.inner_.field_1.slot_ + 0x20)].mDat;
      if ((ppVar4 != (proxy *)0x0) && (0 < ppVar4->protect_level)) {
        domain_manager::add_record
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,(string *)__begin3.inner_.field_1.slot_);
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::iterator::operator++(&__begin3.inner_);
    }
    domain_manager::involve_domain
              (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,domain,false);
    psVar9 = (statement_involve *)
             statement_base::operator_new((statement_base *)0x30,(size_t)domain);
    tree_type<cs::token_base_*>::tree_type(&local_80,(tree_type<cs::token_base_*> *)t);
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pdVar2 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar11 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar11 ==
        (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar11 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_involve::statement_involve(psVar9,&local_80,true,(context_t *)&local_40,pptVar11[-1]);
    __begin3.inner_.ctrl_ = (ctrl_t *)psVar9;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_involve*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
               (statement_involve **)&__begin3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    tree_type<cs::token_base_*>::~tree_type(&local_80);
    cs_impl::any::recycle(&ns);
  }
  return;
}

Assistant:

void method_involve::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_value *vptr = dynamic_cast<token_value *>(tree.root().data());
		if (vptr != nullptr) {
			var ns = vptr->get_value();
			if (ns.type() == typeid(namespace_t)) {
				auto &domain = ns.const_val<namespace_t>()->get_domain();
				for (auto &it: domain) {
					if (domain.get_var_by_id(it.second).is_protect())
						context->instance->storage.add_record(it.first);
				}
				context->instance->storage.involve_domain(domain);
			}
			else
				throw compile_error("Only support involve namespace.");
			mResult.emplace_back(new statement_involve(tree, true, context, raw.front().back()));
		}
		else
			mResult.emplace_back(new statement_involve(tree, false, context, raw.front().back()));
	}